

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  
  uVar3 = std::thread::hardware_concurrency();
  if (uVar3 < 2) {
    std::operator<<((ostream *)&std::cout,"TEST SKIPPED (requires 2 HW threads)\n");
    uVar3 = 0;
  }
  else {
    t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    depspawn::spawn<void(int_volatile&),int&>(f,&i);
    i = 0x14;
    depspawn::spawn<void(int&,int),int&,int>(h,&j,&i);
    depspawn::spawn<void(int&,int),int&,int&>(h,&i,&i);
    depspawn::wait_for_all();
    poVar4 = std::operator<<((ostream *)&std::cout,"Final i=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,i);
    poVar4 = std::operator<<(poVar4," j=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,j);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = j;
    iVar1 = i;
    poVar4 = std::operator<<((ostream *)&std::cout,"TEST ");
    uVar3 = (uint)(iVar2 != 0x14 || iVar1 != 0x14);
    pcVar5 = "SUCCESSFUL";
    if (iVar2 != 0x14 || iVar1 != 0x14) {
      pcVar5 = "UNSUCCESSFUL";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return uVar3;
}

Assistant:

int main()
{
  
  if (std::thread::hardware_concurrency() < 2 ) {
    std::cout << "TEST SKIPPED (requires 2 HW threads)\n";
    return 0;
  }

  t0 = std::chrono::high_resolution_clock::now();

  spawn(f, i);      //f runs for long. Sets i=10
  
  i = 20;
  
  // Because of the use of std::move(i)
  // (1) h does not depend on f and thus does not wait for it
  // (2) h uses the inmediate value of i(20)
  spawn(h, j, std::move(i));
  
  // Although i was set to 20, f sets it to 10 much later
  // h proves that although the second argument (s) is passed by value,
  // it is binded/provided to the function ONLY after f finishes, thus
  // adquiring the value 10, not 20
  spawn(h, i, i);
  
  wait_for_all();

  std::cout << "Final i=" << i << " j=" << j << std::endl;
  
  const bool test_ok = (i == 20) && (j == 20);
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}